

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

void duckdb::BitStringAggOperation::
     Execute<duckdb::uhugeint_t,duckdb::BitAggState<duckdb::uhugeint_t>>
               (BitAggState<duckdb::uhugeint_t> *state,uhugeint_t input,uhugeint_t min)

{
  bool bVar1;
  OutOfRangeException *this;
  uhugeint_t uVar2;
  uhugeint_t input_00;
  idx_t val;
  idx_t local_68;
  string local_60;
  uhugeint_t local_40;
  uhugeint_t local_30;
  
  local_40.upper = min.upper;
  local_40.lower = min.lower;
  local_30.upper = input.upper;
  local_30.lower = input.lower;
  uVar2 = uhugeint_t::operator-(&local_30,&local_40);
  input_00.upper = (uint64_t)&local_68;
  input_00.lower = uVar2.upper;
  bVar1 = Uhugeint::TryCast<unsigned_long>((Uhugeint *)uVar2.lower,input_00,&local_68);
  if (bVar1) {
    Bit::SetBit(&state->value,local_68,1);
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Range too large for bitstring aggregation","");
  OutOfRangeException::OutOfRangeException(this,&local_60);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BitStringAggOperation::Execute(BitAggState<uhugeint_t> &state, uhugeint_t input, uhugeint_t min) {
	idx_t val;
	if (Uhugeint::TryCast(input - min, val)) {
		Bit::SetBit(state.value, val, 1);
	} else {
		throw OutOfRangeException("Range too large for bitstring aggregation");
	}
}